

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall
kj::InsertionOrderIndex::moveImpl(InsertionOrderIndex *this,size_t oldPos,size_t newPos)

{
  bool bVar1;
  Link *__s;
  Fault local_c0;
  Fault f_1;
  uint *local_b0;
  undefined1 local_a8 [8];
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition_1;
  Fault local_70;
  Fault f;
  uint *local_60;
  undefined1 local_58 [8];
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  Link *newLink;
  Link *link;
  size_t newPos_local;
  size_t oldPos_local;
  InsertionOrderIndex *this_local;
  
  __s = this->links + oldPos + 1;
  _kjCondition._32_8_ = this->links + newPos + 1;
  *(Link *)_kjCondition._32_8_ = *__s;
  local_60 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                &this->links[__s->next].prev);
  f.exception = (Exception *)(oldPos + 1);
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_unsigned_long> *)local_58,
             (DebugExpression<unsigned_int&> *)&local_60,(unsigned_long *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x364,FAILED,"links[link.next].prev == oldPos + 1","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_long> *)local_58);
    kj::_::Debug::Fault::fatal(&local_70);
  }
  local_b0 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                &this->links[__s->prev].next);
  f_1.exception = (Exception *)(oldPos + 1);
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_unsigned_long> *)local_a8,
             (DebugExpression<unsigned_int&> *)&local_b0,(unsigned_long *)&f_1);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a8);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x365,FAILED,"links[link.prev].next == oldPos + 1","_kjCondition,",
               (DebugComparison<unsigned_int_&,_unsigned_long> *)local_a8);
    kj::_::Debug::Fault::fatal(&local_c0);
  }
  this->links[__s->next].prev = (int)newPos + 1;
  this->links[__s->prev].next = (int)newPos + 1;
  memset(__s,0xff,8);
  return;
}

Assistant:

void InsertionOrderIndex::moveImpl(size_t oldPos, size_t newPos) {
  Link& link = links[oldPos + 1];
  Link& newLink = links[newPos + 1];

  newLink = link;

  KJ_DASSERT(links[link.next].prev == oldPos + 1);
  KJ_DASSERT(links[link.prev].next == oldPos + 1);
  links[link.next].prev = newPos + 1;
  links[link.prev].next = newPos + 1;

#ifdef KJ_DEBUG
  memset(&link, 0xff, sizeof(Link));
#endif
}